

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O3

void __thiscall MinVR::VRHeadTrackingNode::onVREvent(VRHeadTrackingNode *this,VRDataIndex *e)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  VRAnyCoreType t;
  bool bVar4;
  string local_b0;
  string local_90;
  undefined1 local_70 [16];
  _func_int *local_60 [7];
  
  pcVar1 = (e->_indexName)._M_dataplus._M_p;
  local_70._0_8_ = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (e->_indexName)._M_string_length);
  uVar2 = local_70._0_8_;
  if (local_70._8_8_ == (this->_trackingEvent)._M_string_length) {
    if (local_70._8_8_ == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp((void *)local_70._0_8_,(this->_trackingEvent)._M_dataplus._M_p,local_70._8_8_);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((_func_int **)uVar2 != local_60) {
    operator_delete((void *)uVar2,(ulong)(local_60[0] + 1));
  }
  if (bVar4) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Transform","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    t = VRDataIndex::getValue(e,&local_90,&local_b0,true);
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_70,t);
    VRMatrix4::operator=(&this->_headMatrix,(VRMatrix4 *)local_70);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
VRHeadTrackingNode::onVREvent(const VRDataIndex &e)
{
	if (e.getName() == _trackingEvent) {
        _headMatrix = e.getValue("Transform");
    }
}